

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O2

void decompose(uint32_t n)

{
  ulong uVar1;
  int i;
  ulong uVar2;
  
  printf("%u = ",(ulong)n);
  uVar2 = 0;
  uVar1 = (ulong)n;
  while( true ) {
    if ((uint)uVar1 == 0) break;
    printf("%d*10^%d",uVar1 % 10,uVar2);
    if (9 < (uint)uVar1) {
      printf(" + ");
    }
    uVar2 = (ulong)((int)uVar2 + 1);
    uVar1 = uVar1 / 10;
  }
  putchar(10);
  return;
}

Assistant:

void decompose(uint32_t n) {
  printf("%" PRIu32 " = ", n);
  for (int i = 0; n; i++) {
    printf("%d*10^%d", n % 10, i);
    n /= 10;
    if (n) printf(" + ");
  }
  printf("\n");
}